

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O2

string * hexstring<unsigned_char*>(string *__return_storage_ptr__,uchar *buf,int nLength,char sep)

{
  long lVar1;
  pointer p;
  allocator<char> local_39;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  if (nLength == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_39);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    p = (__return_storage_ptr__->_M_dataplus)._M_p;
    for (lVar1 = 0; nLength != (int)lVar1; lVar1 = lVar1 + 1) {
      byte2hexchars(buf[lVar1],p);
      if (nLength + -1 == (int)lVar1 || sep == '\0') {
        p = p + 2;
      }
      else {
        p[2] = sep;
        p = p + 3;
      }
    }
  }
  return local_38;
}

Assistant:

std::string hexstring(I buf, int nLength, char sep=0)
{
    if (nLength==0)
        return "";
    std::string str;
    str.resize(nLength*2+(sep ? (nLength-1):0));
    char *p= &str[0];
    while(nLength--)
    {
        byte2hexchars(*buf++, p); p+=2;
        if (sep && nLength)
            *p++ = sep;
    }
    return str;
}